

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O1

int __thiscall deci::ast_repeat_t::Generate(ast_repeat_t *this,ostream *output,int pc)

{
  pointer ppaVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  pointer ppaVar5;
  
  (this->super_ast_loop_t).end_loc_pos = pc;
  std::__ostream_insert<char,std::char_traits<char>>(output,": __repeat_",0xb);
  poVar4 = (ostream *)std::ostream::operator<<(output,pc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  ppaVar1 = (this->loop->statements).
            super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar2 = pc;
  for (ppaVar5 = (this->loop->statements).
                 super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppaVar5 != ppaVar1; ppaVar5 = ppaVar5 + 1) {
    uVar2 = (*(*ppaVar5)->_vptr_ast_item_t[2])(*ppaVar5,output,(ulong)uVar2);
  }
  iVar3 = (*this->condition->_vptr_ast_item_t[2])(this->condition,output,(ulong)uVar2);
  std::__ostream_insert<char,std::char_traits<char>>(output,"jz __repeat_",0xc);
  poVar4 = (ostream *)std::ostream::operator<<(output,pc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,": __end_repeat_",0xf);
  poVar4 = (ostream *)std::ostream::operator<<(output,pc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return iVar3 + 1;
}

Assistant:

int ast_repeat_t::Generate(std::ostream& output, int pc) const {

    int repeat_loc = pc;

    this->end_loc_pos = repeat_loc;
    output << ": __repeat_" << repeat_loc << "__" << std::endl;
    pc = this->loop->Generate(output, pc);

    pc = this->condition->Generate(output, pc);
    output << "jz __repeat_" << repeat_loc << "__" << std::endl;
    ++pc;

    output << ": __end_repeat_" << repeat_loc << "__" << std::endl;

    return pc;
  }